

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O3

int CVodeGetSensNumLinSolvSetups(void *cvode_mem,long *nlinsetupsS)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x898;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x8c) != 0) {
      *nlinsetupsS = *(long *)((long)cvode_mem + 0x6d0);
      return 0;
    }
    msgfmt = "Forward sensitivity analysis not activated.";
    iVar1 = -0x28;
    error_code = -0x28;
    line = 0x8a0;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeGetSensNumLinSolvSetups",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVodeGetSensNumLinSolvSetups(void* cvode_mem, long int* nlinsetupsS)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_sensi == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  *nlinsetupsS = cv_mem->cv_nsetupsS;

  return (CV_SUCCESS);
}